

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O0

uint8_t * __thiscall
arangodb::velocypack::ObjectIterator::first(ObjectIterator *this,bool useSequentialIteration)

{
  uint8_t uVar1;
  ValueLength VVar2;
  uint8_t *puVar3;
  byte in_SIL;
  long in_RDI;
  uint8_t head;
  undefined8 in_stack_ffffffffffffffd0;
  uint8_t head_00;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffffd8;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *local_8;
  
  head_00 = (uint8_t)((ulong)in_stack_ffffffffffffffd0 >> 0x38);
  if (*(long *)(in_RDI + 0x10) == 0) {
    local_8 = (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x0;
  }
  else {
    uVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::head
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       0x10f8b6);
    if (uVar1 == '\x14') {
      local_8 = (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::start
                          ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                           0x10f8ce);
      VVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
              getStartOffsetFromCompact(local_8);
      local_8 = local_8 + VVar2;
    }
    else if ((in_SIL & 1) == 0) {
      local_8 = (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x0;
    }
    else {
      puVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::start
                         ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                          0x10f909);
      VVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::findDataOffset
                        (in_stack_ffffffffffffffd8,head_00);
      local_8 = (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                (puVar3 + VVar2);
    }
  }
  return (uint8_t *)local_8;
}

Assistant:

[[nodiscard]] uint8_t const* first(bool useSequentialIteration) const noexcept {
    if (VELOCYPACK_UNLIKELY(_size == 0)) {
      return nullptr;
    }
    auto const head = _slice.head();
    VELOCYPACK_ASSERT(head != 0x0a);  // no empty object allowed here
    if (head == 0x14) {
      return _slice.start() + _slice.getStartOffsetFromCompact();
    } else if (useSequentialIteration) {
      return _slice.start() + _slice.findDataOffset(head);
    }
    return nullptr;
  }